

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

OpResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *this,bool owned,CordRep *edge,size_t delta)

{
  RefcountAndFlags *pRVar1;
  int *piVar2;
  uint uVar3;
  byte bVar4;
  CordRep *rep;
  size_t sVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  CordRepBtree *pCVar11;
  undefined8 uVar12;
  undefined7 in_register_00000031;
  ulong uVar13;
  long lVar14;
  OpResult OVar15;
  
  uVar13 = (ulong)(this->super_CordRep).storage[2];
  if ((int)CONCAT71(in_register_00000031,owned) == 0) {
    bVar4 = (this->super_CordRep).storage[1];
    sVar5 = (this->super_CordRep).length;
    pCVar11 = (CordRepBtree *)operator_new(0x40);
    (pCVar11->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
    (pCVar11->super_CordRep).length = sVar5;
    uVar12 = *(undefined8 *)((long)this->edges_ + 4);
    uVar7 = *(undefined8 *)((long)this->edges_ + 0xc);
    uVar8 = *(undefined8 *)((long)this->edges_ + 0x14);
    uVar9 = *(undefined8 *)((long)this->edges_ + 0x1c);
    uVar10 = *(undefined8 *)((long)this->edges_ + 0x24);
    *(undefined8 *)&(pCVar11->super_CordRep).tag = *(undefined8 *)&(this->super_CordRep).tag;
    *(undefined8 *)((long)pCVar11->edges_ + 4) = uVar12;
    *(undefined8 *)((long)pCVar11->edges_ + 0xc) = uVar7;
    *(undefined8 *)((long)pCVar11->edges_ + 0x14) = uVar8;
    *(undefined8 *)((long)pCVar11->edges_ + 0x1c) = uVar9;
    *(undefined8 *)((long)pCVar11->edges_ + 0x24) = uVar10;
    *(undefined4 *)((long)pCVar11->edges_ + 0x2c) = *(undefined4 *)((long)this->edges_ + 0x2c);
    if (uVar13 - 1 < (ulong)bVar4) {
      __assert_fail("begin <= end",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x277,
                    "absl::Span<CordRep *const> absl::cord_internal::CordRepBtree::Edges(size_t, size_t) const"
                   );
    }
    if (uVar13 == 0) {
      __assert_fail("end <= this->end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x279,
                    "absl::Span<CordRep *const> absl::cord_internal::CordRepBtree::Edges(size_t, size_t) const"
                   );
    }
    uVar12 = 1;
    if (uVar13 - 1 != (ulong)bVar4) {
      lVar14 = (ulong)bVar4 << 3;
      do {
        lVar6 = *(long *)((long)this->edges_ + lVar14);
        if (lVar6 == 0) {
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        piVar2 = (int *)(lVar6 + 8);
        *piVar2 = *piVar2 + 2;
        UNLOCK();
        lVar14 = lVar14 + 8;
      } while (uVar13 * 8 + -8 != lVar14);
    }
  }
  else {
    rep = *(CordRep **)((this->super_CordRep).storage + uVar13 * 8 + -5);
    if (rep == (CordRep *)0x0) {
      __assert_fail("rep != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x397,"static void absl::cord_internal::CordRep::Unref(CordRep *)");
    }
    LOCK();
    pRVar1 = &rep->refcount;
    uVar3 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar3 & 1) == 0 && (int)uVar3 < 1) {
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0xac,
                    "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
    }
    uVar12 = 0;
    pCVar11 = this;
    if (uVar3 == 2) {
      CordRep::Destroy(rep);
    }
  }
  *(CordRep **)((pCVar11->super_CordRep).storage + uVar13 * 8 + -5) = edge;
  (pCVar11->super_CordRep).length = (pCVar11->super_CordRep).length + delta;
  OVar15._8_8_ = uVar12;
  OVar15.tree = pCVar11;
  return OVar15;
}

Assistant:

OpResult CordRepBtree::SetEdge(bool owned, CordRep* edge, size_t delta) {
  OpResult result;
  const size_t idx = index(edge_type);
  if (owned) {
    result = {this, kSelf};
    CordRep::Unref(edges_[idx]);
  } else {
    // Create a copy containing all unchanged edges. Unchanged edges are the
    // open interval [begin, back) or [begin + 1, end) depending on `edge_type`.
    // We conveniently cover both case using a constexpr `shift` being 0 or 1
    // as `end :== back + 1`.
    result = {CopyRaw(length), kCopied};
    constexpr int shift = edge_type == kFront ? 1 : 0;
    for (CordRep* r : Edges(begin() + shift, back() + shift)) {
      CordRep::Ref(r);
    }
  }
  result.tree->edges_[idx] = edge;
  result.tree->length += delta;
  return result;
}